

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
testing::StrEq<char_const*>
          (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,testing *this,StringLike<const_char_*> *str)

{
  long lVar1;
  allocator local_61;
  uint *local_60;
  long local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  uint *local_40;
  long local_38;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined2 local_20;
  
  std::__cxx11::string::string((string *)&local_60,*(char **)this,&local_61);
  lVar1 = local_58;
  if (local_60 == &local_50) {
    uStack_28 = uStack_48;
    uStack_24 = uStack_44;
    local_40 = (uint *)&local_30;
  }
  else {
    local_40 = local_60;
  }
  local_30 = CONCAT44(uStack_4c,local_50);
  local_38 = local_58;
  local_58 = 0;
  local_50 = local_50 & 0xffffff00;
  local_20 = 0x101;
  (__return_storage_ptr__->impl_).string_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->impl_).string_.field_2;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_40,lVar1 + (long)local_40);
  (__return_storage_ptr__->impl_).expect_eq_ = (bool)(undefined1)local_20;
  (__return_storage_ptr__->impl_).case_sensitive_ = (bool)local_20._1_1_;
  if (local_40 != (uint *)&local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT44(uStack_4c,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::StrEqualityMatcher<std::string> > StrEq(
    const internal::StringLike<T>& str) {
  return MakePolymorphicMatcher(
      internal::StrEqualityMatcher<std::string>(std::string(str), true, true));
}